

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlDocDumpInternal(xmlOutputBufferPtr buf,xmlDocPtr doc,char *encoding,int format)

{
  xmlSaveCtxt ctxt;
  xmlSaveCtxt local_98;
  
  local_98.options = 0;
  local_98.level = 0;
  local_98.indent[0x3c] = '\0';
  local_98._97_3_ = 0;
  local_98.indent_nr = 0;
  local_98.indent_size = 0;
  local_98._108_4_ = 0;
  local_98.indent[0x2c] = '\0';
  local_98.indent[0x2d] = '\0';
  local_98.indent[0x2e] = '\0';
  local_98.indent[0x2f] = '\0';
  local_98.indent[0x30] = '\0';
  local_98.indent[0x31] = '\0';
  local_98.indent[0x32] = '\0';
  local_98.indent[0x33] = '\0';
  local_98.indent[0x34] = '\0';
  local_98.indent[0x35] = '\0';
  local_98.indent[0x36] = '\0';
  local_98.indent[0x37] = '\0';
  local_98.indent[0x38] = '\0';
  local_98.indent[0x39] = '\0';
  local_98.indent[0x3a] = '\0';
  local_98.indent[0x3b] = '\0';
  local_98.indent[0x1c] = '\0';
  local_98.indent[0x1d] = '\0';
  local_98.indent[0x1e] = '\0';
  local_98.indent[0x1f] = '\0';
  local_98.indent[0x20] = '\0';
  local_98.indent[0x21] = '\0';
  local_98.indent[0x22] = '\0';
  local_98.indent[0x23] = '\0';
  local_98.indent[0x24] = '\0';
  local_98.indent[0x25] = '\0';
  local_98.indent[0x26] = '\0';
  local_98.indent[0x27] = '\0';
  local_98.indent[0x28] = '\0';
  local_98.indent[0x29] = '\0';
  local_98.indent[0x2a] = '\0';
  local_98.indent[0x2b] = '\0';
  local_98.indent[0xc] = '\0';
  local_98.indent[0xd] = '\0';
  local_98.indent[0xe] = '\0';
  local_98.indent[0xf] = '\0';
  local_98.indent[0x10] = '\0';
  local_98.indent[0x11] = '\0';
  local_98.indent[0x12] = '\0';
  local_98.indent[0x13] = '\0';
  local_98.indent[0x14] = '\0';
  local_98.indent[0x15] = '\0';
  local_98.indent[0x16] = '\0';
  local_98.indent[0x17] = '\0';
  local_98.indent[0x18] = '\0';
  local_98.indent[0x19] = '\0';
  local_98.indent[0x1a] = '\0';
  local_98.indent[0x1b] = '\0';
  local_98.format = 0;
  local_98.indent[0] = '\0';
  local_98.indent[1] = '\0';
  local_98.indent[2] = '\0';
  local_98.indent[3] = '\0';
  local_98.indent[4] = '\0';
  local_98.indent[5] = '\0';
  local_98.indent[6] = '\0';
  local_98.indent[7] = '\0';
  local_98.indent[8] = '\0';
  local_98.indent[9] = '\0';
  local_98.indent[10] = '\0';
  local_98.indent[0xb] = '\0';
  local_98.encoding = (xmlChar *)0x0;
  local_98.handler = (xmlCharEncodingHandlerPtr)0x0;
  local_98.escape = (xmlCharEncodingOutputFunc)0x0;
  if (buf->encoder != (xmlCharEncodingHandlerPtr)0x0) {
    encoding = buf->encoder->name;
    local_98.encoding = (xmlChar *)encoding;
  }
  local_98.buf = buf;
  xmlSaveCtxtInit(&local_98,0x21 - (uint)(format == 0));
  xmlSaveDocInternal(&local_98,doc,(xmlChar *)encoding);
  return;
}

Assistant:

static void
xmlDocDumpInternal(xmlOutputBufferPtr buf, xmlDocPtr doc, const char *encoding,
                   int format) {
    xmlSaveCtxt ctxt;
    int options;

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;

    if (buf->encoder != NULL) {
        /*
         * Keep original encoding
         */
        encoding = buf->encoder->name;
        ctxt.encoding = BAD_CAST encoding;
    }

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

    xmlSaveDocInternal(&ctxt, doc, (const xmlChar *) encoding);
}